

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O2

void bm_init_skiptable(QStringView needle,uchar *skiptable,CaseSensitivity cs)

{
  char16_t *start;
  char32_t cVar1;
  long lVar2;
  uchar uVar3;
  int __c;
  ulong uVar4;
  ulong uVar5;
  char16_t *ch;
  
  uVar4 = needle.m_size;
  uVar5 = 0x100;
  if ((long)uVar4 < 0x100) {
    uVar5 = uVar4;
  }
  if (cs == CaseSensitive) {
    uVar5 = uVar4;
  }
  uVar4 = 0xff;
  if ((int)uVar5 < 0xff) {
    uVar4 = uVar5 & 0xffffffff;
  }
  __c = (int)uVar4;
  memset(skiptable,__c,0x100);
  start = needle.m_data + (uVar5 - (long)__c);
  ch = start;
  if (cs == CaseSensitive) {
    uVar3 = (uchar)uVar4;
    for (lVar2 = 0; uVar3 = uVar3 + 0xff, (int)lVar2 != __c; lVar2 = lVar2 + 1) {
      skiptable[(byte)start[lVar2]] = uVar3;
    }
  }
  else {
    while ((int)uVar4 != 0) {
      cVar1 = foldCase(ch,start);
      skiptable[(uint)(cVar1 & 0xff)] = (char)uVar4 + 0xff;
      uVar4 = (ulong)((int)uVar4 - 1);
      ch = ch + 1;
    }
  }
  return;
}

Assistant:

static void bm_init_skiptable(QStringView needle, uchar *skiptable, Qt::CaseSensitivity cs)
{
    const char16_t *uc = needle.utf16();
    const qsizetype len =
            cs == Qt::CaseSensitive ? needle.size() : qMin(needle.size(), FoldBufferCapacity);
    int l = qMin(int(len), 255);
    memset(skiptable, l, 256 * sizeof(uchar));
    uc += len - l;
    if (cs == Qt::CaseSensitive) {
        while (l--) {
            skiptable[*uc & 0xff] = l;
            ++uc;
        }
    } else {
        const char16_t *start = uc;
        while (l--) {
            skiptable[foldCase(uc, start) & 0xff] = l;
            ++uc;
        }
    }
}